

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-utils.h
# Opt level: O0

uint64_t dg::llvmutils::getConstantSizeValue(Value *op)

{
  Value *in_RDI;
  uint64_t sz;
  uint64_t local_8;
  
  local_8 = getConstantValue(in_RDI);
  if (local_8 == 0xffffffffffffffff) {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

inline uint64_t getConstantSizeValue(const llvm::Value *op) {
    auto sz = getConstantValue(op);
    // if the size is unknown, make it 0, so that pointer
    // analysis correctly computes offets into this memory
    // (which is always UNKNOWN)
    if (sz == ~static_cast<uint64_t>(0))
        return 0;
    return sz;
}